

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::parseSignals(Moc *this,ClassDef *def)

{
  bool bVar1;
  ClassDef *in_RSI;
  Moc *in_RDI;
  long in_FS_OFFSET;
  FunctionDef funcDef;
  QTypeRevision defaultRevision;
  undefined4 in_stack_fffffffffffffef8;
  Token in_stack_fffffffffffffefc;
  Token in_stack_ffffffffffffff00;
  Token in_stack_ffffffffffffff04;
  Token TVar2;
  undefined1 local_e0 [20];
  Token in_stack_ffffffffffffff34;
  Moc *in_stack_ffffffffffffff38;
  Moc *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff60;
  int local_24;
  byte local_1f;
  byte local_1d;
  QTypeRevision local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a.m_minorVersion = 0xaa;
  local_a.m_majorVersion = 0xaa;
  QTypeRevision::QTypeRevision(&local_a);
  bVar1 = Parser::test(&in_RDI->super_Parser,in_stack_ffffffffffffff04);
  if (bVar1) {
    local_a = parseRevision(in_stack_ffffffffffffff40);
  }
  Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc);
LAB_00152112:
  while( true ) {
    do {
      bVar1 = inClass(in_RDI,in_RSI);
      TVar2 = in_stack_ffffffffffffff04 & 0xffffff;
      if (bVar1) {
        bVar1 = Parser::hasNext((Parser *)
                                (CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00) &
                                0xffffffffffffff));
        TVar2 = CONCAT13(bVar1,(int3)TVar2);
      }
      in_stack_ffffffffffffff04 = TVar2;
      if ((char)(in_stack_ffffffffffffff04 >> 0x18) == '\0') goto LAB_00152315;
      in_stack_ffffffffffffff00 = Parser::next(&in_RDI->super_Parser);
    } while (in_stack_ffffffffffffff00 == SEMIC);
    if (in_stack_ffffffffffffff00 != FRIEND) break;
    until(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  }
  if (2 < in_stack_ffffffffffffff00 - PRIVATE) {
    if (in_stack_ffffffffffffff00 == USING) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        Parser::error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      goto LAB_00152333;
    }
    if (in_stack_ffffffffffffff00 != Q_SIGNALS_TOKEN && in_stack_ffffffffffffff00 != Q_SLOTS_TOKEN)
    {
      Parser::prev(&in_RDI->super_Parser);
      memset(local_e0,0xaa,0xd0);
      FunctionDef::FunctionDef
                ((FunctionDef *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      parseFunction((Moc *)in_RSI,(FunctionDef *)in_RDI,SUB41(in_stack_ffffffffffffff04 >> 0x18,0));
      if ((local_1f & 1) != 0) {
        Parser::warning((Parser *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_ffffffffffffff48);
      }
      if ((local_1d & 1) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          Parser::error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        goto LAB_00152333;
      }
      if (local_24 < 1) {
        bVar1 = QTypeRevision::isValid
                          ((QTypeRevision *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        if (bVar1) {
          local_24 = QTypeRevision::toEncodedVersion<int,_true>(&local_a);
          in_RSI->revisionedMethods = in_RSI->revisionedMethods + 1;
        }
      }
      else {
        in_RSI->revisionedMethods = in_RSI->revisionedMethods + 1;
      }
      QList<FunctionDef>::operator+=
                ((QList<FunctionDef> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                 ,(parameter_type)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      handleDefaultArguments
                ((QList<FunctionDef> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                 ,(FunctionDef *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      FunctionDef::~FunctionDef
                ((FunctionDef *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      goto LAB_00152112;
    }
  }
  Parser::prev(&in_RDI->super_Parser);
LAB_00152315:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00152333:
  __stack_chk_fail();
}

Assistant:

void Moc::parseSignals(ClassDef *def)
{
    QTypeRevision defaultRevision;
    if (test(Q_REVISION_TOKEN))
        defaultRevision = parseRevision();

    next(COLON);
    while (inClass(def) && hasNext()) {
        switch (next()) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case Q_SIGNALS_TOKEN:
        case Q_SLOTS_TOKEN:
            prev();
            return;
        case SEMIC:
            continue;
        case FRIEND:
            until(SEMIC);
            continue;
        case USING:
            error("'using' directive not supported in 'signals' section");
        default:
            prev();
        }
        FunctionDef funcDef;
        funcDef.access = FunctionDef::Public;
        parseFunction(&funcDef);
        if (funcDef.isVirtual)
            warning("Signals cannot be declared virtual");
        if (funcDef.inlineCode)
            error("Not a signal declaration");
        if (funcDef.revision > 0) {
            ++def->revisionedMethods;
        } else if (defaultRevision.isValid()) {
            funcDef.revision = defaultRevision.toEncodedVersion<int>();
            ++def->revisionedMethods;
        }
        def->signalList += funcDef;
        handleDefaultArguments(&def->signalList, funcDef);
    }
}